

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O0

void Wlc_NtkPrintStats(Wlc_Ntk_t *p,int fDistrib,int fVerbose)

{
  uint uVar1;
  int iVar2;
  uint local_1c;
  int i;
  int fVerbose_local;
  int fDistrib_local;
  Wlc_Ntk_t *p_local;
  
  printf("%-20s : ",p->pName);
  uVar1 = Wlc_NtkPiNum(p);
  printf("PI = %4d  ",(ulong)uVar1);
  uVar1 = Wlc_NtkPoNum(p);
  printf("PO = %4d  ",(ulong)uVar1);
  uVar1 = Wlc_NtkFfNum(p);
  printf("FF = %4d  ",(ulong)uVar1);
  uVar1 = Wlc_NtkObjNum(p);
  printf("Obj = %6d  ",(ulong)uVar1);
  iVar2 = Wlc_NtkMemUsage(p);
  printf("Mem = %.3f MB",((double)iVar2 * 1.0) / 1048576.0);
  printf("\n");
  if (fDistrib == 0) {
    if (fVerbose != 0) {
      printf("Node type statistics:\n");
      for (local_1c = 1; (int)local_1c < 0x2d; local_1c = local_1c + 1) {
        if (p->nObjs[(int)local_1c] != 0) {
          if ((p->nAnds[0] == 0) || (p->nAnds[(int)local_1c] == 0)) {
            printf("%2d  :  %-8s  %6d\n",(ulong)local_1c,Wlc_Names[(int)local_1c],
                   (ulong)(uint)p->nObjs[(int)local_1c]);
          }
          else {
            printf("%2d  :  %-8s  %6d  %7.2f %%\n",
                   ((double)p->nAnds[(int)local_1c] * 100.0) / (double)p->nAnds[0],(ulong)local_1c,
                   Wlc_Names[(int)local_1c],(ulong)(uint)p->nObjs[(int)local_1c]);
          }
        }
      }
    }
  }
  else {
    Wlc_NtkPrintDistrib(p,fVerbose);
  }
  return;
}

Assistant:

void Wlc_NtkPrintStats( Wlc_Ntk_t * p, int fDistrib, int fVerbose )
{
    int i;
    printf( "%-20s : ",        p->pName );
    printf( "PI = %4d  ",      Wlc_NtkPiNum(p) );
    printf( "PO = %4d  ",      Wlc_NtkPoNum(p) );
    printf( "FF = %4d  ",      Wlc_NtkFfNum(p) );
    printf( "Obj = %6d  ",     Wlc_NtkObjNum(p) );
    printf( "Mem = %.3f MB",   1.0*Wlc_NtkMemUsage(p)/(1<<20) );
    printf( "\n" );
    if ( fDistrib )
    {
        Wlc_NtkPrintDistrib( p, fVerbose );
        return;
    }
    if ( !fVerbose )
        return;
    printf( "Node type statistics:\n" );
    for ( i = 1; i < WLC_OBJ_NUMBER; i++ )
    {
        if ( !p->nObjs[i] )
            continue;
        if ( p->nAnds[0] && p->nAnds[i] )
            printf( "%2d  :  %-8s  %6d  %7.2f %%\n", i, Wlc_Names[i], p->nObjs[i], 100.0*p->nAnds[i]/p->nAnds[0] );
        else
            printf( "%2d  :  %-8s  %6d\n", i, Wlc_Names[i], p->nObjs[i] );
    }
}